

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestUInt value)

{
  char **__s;
  allocator<char> local_41;
  char **local_40;
  char *current;
  UIntToStringBuffer buffer;
  LargestUInt value_local;
  
  local_40 = (char **)(buffer + 0x11);
  unique0x100000b6 = this;
  uintToString((LargestUInt)this,(char **)&local_40);
  __s = local_40;
  if (&current <= local_40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)__s,&local_41);
    std::allocator<char>::~allocator(&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x9c,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

JSONCPP_STRING valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}